

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReaderIncrMergeInit(PmaReader *pReadr,int eMode)

{
  long *plVar1;
  long lVar2;
  int in_ESI;
  long in_RDI;
  int mxSz;
  sqlite3 *db;
  SortSubtask *pTask;
  IncrMerger *pIncr;
  int rc;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  SortSubtask *pTask_00;
  sqlite3 *db_00;
  int local_10;
  
  plVar1 = *(long **)(in_RDI + 0x48);
  db_00 = (sqlite3 *)*plVar1;
  pTask_00 = (SortSubtask *)db_00->pDfltColl->xDel;
  local_10 = vdbeMergeEngineInit(pTask_00,(MergeEngine *)
                                          CONCAT44(in_stack_ffffffffffffffd4,
                                                   in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc);
  if (local_10 == 0) {
    iVar3 = (int)plVar1[3];
    if ((int)plVar1[4] == 0) {
      lVar2._0_4_ = db_00->errCode;
      lVar2._4_4_ = db_00->errByteOffset;
      if (lVar2 == 0) {
        local_10 = vdbeSorterOpenTempFile
                             (db_00,(i64)pTask_00,
                              (sqlite3_file **)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
        db_00->errMask = 0;
        db_00->iSysErrno = 0;
      }
      if (local_10 == 0) {
        plVar1[7] = *(long *)&db_00->errCode;
        plVar1[2] = *(long *)&db_00->errMask;
        *(long *)&db_00->errMask = (long)iVar3 + *(long *)&db_00->errMask;
      }
    }
    else {
      local_10 = vdbeSorterOpenTempFile
                           (db_00,(i64)pTask_00,
                            (sqlite3_file **)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
      if (local_10 == 0) {
        local_10 = vdbeSorterOpenTempFile
                             (db_00,(i64)pTask_00,
                              (sqlite3_file **)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
      }
    }
  }
  if ((local_10 == 0) && ((int)plVar1[4] != 0)) {
    local_10 = vdbeIncrPopulate((IncrMerger *)db);
  }
  if ((local_10 == 0) && (in_ESI != 1)) {
    local_10 = vdbePmaReaderNext((PmaReader *)pTask_00);
  }
  return local_10;
}

Assistant:

static int vdbePmaReaderIncrMergeInit(PmaReader *pReadr, int eMode){
  int rc = SQLITE_OK;
  IncrMerger *pIncr = pReadr->pIncr;
  SortSubtask *pTask = pIncr->pTask;
  sqlite3 *db = pTask->pSorter->db;

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  rc = vdbeMergeEngineInit(pTask, pIncr->pMerger, eMode);

  /* Set up the required files for pIncr. A multi-threaded IncrMerge object
  ** requires two temp files to itself, whereas a single-threaded object
  ** only requires a region of pTask->file2. */
  if( rc==SQLITE_OK ){
    int mxSz = pIncr->mxSz;
#if SQLITE_MAX_WORKER_THREADS>0
    if( pIncr->bUseThread ){
      rc = vdbeSorterOpenTempFile(db, mxSz, &pIncr->aFile[0].pFd);
      if( rc==SQLITE_OK ){
        rc = vdbeSorterOpenTempFile(db, mxSz, &pIncr->aFile[1].pFd);
      }
    }else
#endif
    /*if( !pIncr->bUseThread )*/{
      if( pTask->file2.pFd==0 ){
        assert( pTask->file2.iEof>0 );
        rc = vdbeSorterOpenTempFile(db, pTask->file2.iEof, &pTask->file2.pFd);
        pTask->file2.iEof = 0;
      }
      if( rc==SQLITE_OK ){
        pIncr->aFile[1].pFd = pTask->file2.pFd;
        pIncr->iStartOff = pTask->file2.iEof;
        pTask->file2.iEof += mxSz;
      }
    }
  }

#if SQLITE_MAX_WORKER_THREADS>0
  if( rc==SQLITE_OK && pIncr->bUseThread ){
    /* Use the current thread to populate aFile[1], even though this
    ** PmaReader is multi-threaded. If this is an INCRINIT_TASK object,
    ** then this function is already running in background thread
    ** pIncr->pTask->thread.
    **
    ** If this is the INCRINIT_ROOT object, then it is running in the
    ** main VDBE thread. But that is Ok, as that thread cannot return
    ** control to the VDBE or proceed with anything useful until the
    ** first results are ready from this merger object anyway.
    */
    assert( eMode==INCRINIT_ROOT || eMode==INCRINIT_TASK );
    rc = vdbeIncrPopulate(pIncr);
  }
#endif

  if( rc==SQLITE_OK && (SQLITE_MAX_WORKER_THREADS==0 || eMode!=INCRINIT_TASK) ){
    rc = vdbePmaReaderNext(pReadr);
  }

  return rc;
}